

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialect_detection.cpp
# Opt level: O2

bool duckdb::AreCommentsAcceptable
               (ColumnCountResult *result,idx_t num_cols,bool comment_set_by_user)

{
  vector<duckdb::ColumnCount,_true> *this;
  byte bVar1;
  const_reference pvVar2;
  undefined3 in_register_00000011;
  idx_t i;
  ulong __n;
  bool bVar3;
  double local_38;
  double local_30;
  
  bVar3 = true;
  if (CONCAT31(in_register_00000011,comment_set_by_user) == 0) {
    this = &result->column_counts;
    local_30 = 0.0;
    bVar1 = 0;
    local_38 = 0.0;
    for (__n = 0; __n < result->result_position; __n = __n + 1) {
      pvVar2 = vector<duckdb::ColumnCount,_true>::get<true>(this,__n);
      if ((pvVar2->is_comment != false) ||
         (pvVar2 = vector<duckdb::ColumnCount,_true>::get<true>(this,__n),
         pvVar2->is_mid_comment == true)) {
        local_30 = local_30 + 1.0;
        pvVar2 = vector<duckdb::ColumnCount,_true>::get<true>(this,__n);
        if ((pvVar2->number_of_columns != num_cols) &&
           (pvVar2 = vector<duckdb::ColumnCount,_true>::get<true>(this,__n),
           pvVar2->is_comment == true)) {
          local_38 = local_38 + 1.0;
          bVar1 = 1;
        }
        pvVar2 = vector<duckdb::ColumnCount,_true>::get<true>(this,__n);
        if ((pvVar2->number_of_columns == num_cols) &&
           (pvVar2 = vector<duckdb::ColumnCount,_true>::get<true>(this,__n),
           pvVar2->is_mid_comment == true)) {
          local_38 = local_38 + 1.0;
        }
      }
    }
    if ((bool)(local_38 != 0.0 & bVar1)) {
      bVar3 = 0.6 <= local_38 / local_30;
    }
    else {
      bVar3 = (((result->super_ScannerResult).state_machine)->state_machine_options).comment.value
              == '\0';
    }
  }
  return bVar3;
}

Assistant:

bool AreCommentsAcceptable(const ColumnCountResult &result, idx_t num_cols, bool comment_set_by_user) {
	if (comment_set_by_user) {
		return true;
	}
	// For a comment to be acceptable, we want 3/5th's the majority of unmatched in the columns
	constexpr double min_majority = 0.6;
	// detected comments, are all lines that started with a comment character.
	double detected_comments = 0;
	// If at least one comment is a full line comment
	bool has_full_line_comment = false;
	// valid comments are all lines where the number of columns does not fit our expected number of columns.
	double valid_comments = 0;
	for (idx_t i = 0; i < result.result_position; i++) {
		if (result.column_counts[i].is_comment || result.column_counts[i].is_mid_comment) {
			detected_comments++;
			if (result.column_counts[i].number_of_columns != num_cols && result.column_counts[i].is_comment) {
				has_full_line_comment = true;
				valid_comments++;
			}
			if (result.column_counts[i].number_of_columns == num_cols && result.column_counts[i].is_mid_comment) {
				valid_comments++;
			}
		}
	}
	// If we do not encounter at least one full line comment, we do not consider this comment option.
	if (valid_comments == 0 || !has_full_line_comment) {
		// this is only valid if our comment character is \0
		if (result.state_machine.state_machine_options.comment.GetValue() == '\0') {
			return true;
		}
		return false;
	}

	return valid_comments / detected_comments >= min_majority;
}